

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O0

void __kmp_api_omp_set_schedule_(kmp_sched_t *kind,int *modifier)

{
  int in_stack_0000008c;
  kmp_sched_t in_stack_00000090;
  int in_stack_00000094;
  
  __kmp_get_global_thread_id_reg();
  __kmp_set_schedule(in_stack_00000094,in_stack_00000090,in_stack_0000008c);
  return;
}

Assistant:

void FTN_STDCALL KMP_EXPAND_NAME(FTN_SET_SCHEDULE)(kmp_sched_t KMP_DEREF kind,
                                                   int KMP_DEREF modifier) {
#ifdef KMP_STUB
  __kmps_set_schedule(KMP_DEREF kind, KMP_DEREF modifier);
#else
  /* TO DO: For the per-task implementation of the internal controls */
  __kmp_set_schedule(__kmp_entry_gtid(), KMP_DEREF kind, KMP_DEREF modifier);
#endif
}